

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

Data * __thiscall
QTzTimeZonePrivate::nextTransition(QTzTimeZonePrivate *this,qint64 afterMSecsSinceEpoch)

{
  QTzTransitionTime tran;
  bool bVar1;
  QTzTransitionTime *pQVar2;
  const_iterator o;
  const_iterator o_00;
  long in_RDX;
  const_iterator in_RSI;
  const_iterator in_RDI;
  long in_FS_OFFSET;
  const_iterator last;
  const_iterator it;
  QList<QTimeZonePrivate::Data> posixTrans;
  Data *in_stack_ffffffffffffff08;
  Data *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  QTzTimeZonePrivate *in_stack_ffffffffffffff20;
  Data *pDVar3;
  qint64 in_stack_ffffffffffffff28;
  anon_class_8_1_ead304a0 in_stack_ffffffffffffff30;
  anon_class_8_1_ead304a0 __pred;
  const_iterator in_stack_ffffffffffffff50;
  qint64 in_stack_ffffffffffffff70;
  QTzTimeZonePrivate *in_stack_ffffffffffffff78;
  const_iterator local_38;
  const_iterator local_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __pred.afterMSecsSinceEpoch = (qint64)in_RDI.i;
  bVar1 = QByteArray::isEmpty((QByteArray *)0x74efab);
  if (bVar1) {
LAB_0074f13e:
    local_38.i = (QTzTransitionTime *)&DAT_aaaaaaaaaaaaaaaa;
    tranCache((QTzTimeZonePrivate *)in_RSI.i);
    QList<QTzTransitionTime>::cbegin((QList<QTzTransitionTime> *)in_stack_ffffffffffffff10);
    tranCache((QTzTimeZonePrivate *)in_RSI.i);
    QList<QTzTransitionTime>::cend((QList<QTzTransitionTime> *)in_stack_ffffffffffffff10);
    local_38 = std::
               partition_point<QList<QTzTransitionTime>::const_iterator,QTzTimeZonePrivate::nextTransition(long_long)const::__1>
                         (in_stack_ffffffffffffff50,in_RSI,__pred);
    tranCache((QTzTimeZonePrivate *)in_RSI.i);
    o_00 = QList<QTzTransitionTime>::cend((QList<QTzTransitionTime> *)in_stack_ffffffffffffff10);
    bVar1 = QList<QTzTransitionTime>::const_iterator::operator!=(&local_38,o_00);
    if (bVar1) {
      QList<QTzTransitionTime>::const_iterator::operator*(&local_38);
      tran._8_8_ = in_stack_ffffffffffffff30.afterMSecsSinceEpoch;
      tran.atMSecsSinceEpoch = in_stack_ffffffffffffff28;
      dataForTzTransition(in_stack_ffffffffffffff20,tran);
    }
    else {
      QTimeZonePrivate::Data::Data(in_stack_ffffffffffffff10);
    }
  }
  else {
    tranCache((QTzTimeZonePrivate *)in_RSI.i);
    bVar1 = QList<QTzTransitionTime>::isEmpty((QList<QTzTransitionTime> *)0x74efc5);
    if (!bVar1) {
      tranCache((QTzTimeZonePrivate *)in_RSI.i);
      pQVar2 = QList<QTzTransitionTime>::last
                         ((QList<QTzTransitionTime> *)
                          CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      if (in_RDX <= pQVar2->atMSecsSinceEpoch) goto LAB_0074f13e;
    }
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    pDVar3 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    getPosixTransitions(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    local_30.i = pDVar3;
    QList<QTimeZonePrivate::Data>::cbegin
              ((QList<QTimeZonePrivate::Data> *)in_stack_ffffffffffffff10);
    QList<QTimeZonePrivate::Data>::cend((QList<QTimeZonePrivate::Data> *)in_stack_ffffffffffffff10);
    local_30 = std::
               partition_point<QList<QTimeZonePrivate::Data>::const_iterator,QTzTimeZonePrivate::nextTransition(long_long)const::__0>
                         ((const_iterator)__pred.afterMSecsSinceEpoch,in_RDI,
                          in_stack_ffffffffffffff30);
    o = QList<QTimeZonePrivate::Data>::cend(in_stack_ffffffffffffff10);
    bVar1 = QList<QTimeZonePrivate::Data>::const_iterator::operator==(&local_30,o);
    if (bVar1) {
      QTimeZonePrivate::Data::Data(in_stack_ffffffffffffff10);
    }
    else {
      pDVar3 = QList<QTimeZonePrivate::Data>::const_iterator::operator*(&local_30);
      QTimeZonePrivate::Data::Data(pDVar3,in_stack_ffffffffffffff08);
    }
    QList<QTimeZonePrivate::Data>::~QList((QList<QTimeZonePrivate::Data> *)0x74f115);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (Data *)__pred.afterMSecsSinceEpoch;
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::nextTransition(qint64 afterMSecsSinceEpoch) const
{
    // If the required time is after the last transition (or there were none)
    // and we have a POSIX rule, then use it:
    if (!cached_data.m_posixRule.isEmpty()
        && (tranCache().isEmpty() || tranCache().last().atMSecsSinceEpoch < afterMSecsSinceEpoch)) {
        QList<Data> posixTrans = getPosixTransitions(afterMSecsSinceEpoch);
        auto it = std::partition_point(posixTrans.cbegin(), posixTrans.cend(),
                                       [afterMSecsSinceEpoch] (const Data &at) {
                                           return at.atMSecsSinceEpoch <= afterMSecsSinceEpoch;
                                       });

        return it == posixTrans.cend() ? Data{} : *it;
    }

    // Otherwise, if we can find a valid tran, use its rule:
    auto last = std::partition_point(tranCache().cbegin(), tranCache().cend(),
                                     [afterMSecsSinceEpoch] (QTzTransitionTime at) {
                                         return at.atMSecsSinceEpoch <= afterMSecsSinceEpoch;
                                     });
    return last != tranCache().cend() ? dataForTzTransition(*last) : Data{};
}